

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.h
# Opt level: O0

void __thiscall sptk::MedianFilter::~MedianFilter(MedianFilter *this)

{
  InputSourceInterface *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000040;
  
  in_RDI->_vptr_InputSourceInterface = (_func_int **)&PTR__MedianFilter_0012ac10;
  std::
  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~deque(in_stack_00000040);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  InputSourceInterface::~InputSourceInterface(in_RDI);
  return;
}

Assistant:

~MedianFilter() override {
  }